

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

int ndiGetTXTransform(ndicapi *pol,int portHandle,double *transform)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  iVar2 = pol->TxHandleCount;
  uVar5 = 0;
  if ((long)iVar2 < 1) {
LAB_0010979b:
    iVar3 = 1;
    if ((int)uVar5 != iVar2) {
      uVar5 = uVar5 & 0xffffffff;
      cVar1 = pol->TxTransforms[uVar5][0];
      if ((cVar1 != '\0') && (cVar1 != 'D')) {
        if (cVar1 == 'M') {
          iVar3 = 2;
        }
        else {
          lVar4 = ndiSignedToLong(pol->TxTransforms[uVar5],6);
          *transform = (double)lVar4 * 0.0001;
          lVar4 = ndiSignedToLong(pol->TxTransforms[uVar5] + 6,6);
          transform[1] = (double)lVar4 * 0.0001;
          lVar4 = ndiSignedToLong(pol->TxTransforms[uVar5] + 0xc,6);
          transform[2] = (double)lVar4 * 0.0001;
          lVar4 = ndiSignedToLong(pol->TxTransforms[uVar5] + 0x12,6);
          transform[3] = (double)lVar4 * 0.0001;
          lVar4 = ndiSignedToLong(pol->TxTransforms[uVar5] + 0x18,7);
          transform[4] = (double)lVar4 * 0.01;
          lVar4 = ndiSignedToLong(pol->TxTransforms[uVar5] + 0x1f,7);
          transform[5] = (double)lVar4 * 0.01;
          lVar4 = ndiSignedToLong(pol->TxTransforms[uVar5] + 0x26,7);
          transform[6] = (double)lVar4 * 0.01;
          lVar4 = ndiSignedToLong(pol->TxTransforms[uVar5] + 0x2d,6);
          transform[7] = (double)lVar4 * 0.0001;
          iVar3 = 0;
        }
      }
    }
  }
  else {
    do {
      if ((uint)pol->TxHandles[uVar5] == portHandle) goto LAB_0010979b;
      uVar5 = uVar5 + 1;
    } while ((long)iVar2 != uVar5);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

ndicapiExport int ndiGetTXTransform(ndicapi* pol, int portHandle, double transform[8])
{
  char* readPointer;
  int i, n;

  n = pol->TxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->TxHandles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return NDI_DISABLED;
  }

  readPointer = pol->TxTransforms[i];
  if (*readPointer == 'D' || *readPointer == '\0')
  {
    return NDI_DISABLED;
  }
  else if (*readPointer == 'M')
  {
    return NDI_MISSING;
  }

  transform[0] = ndiSignedToLong(&readPointer[0], 6) * 0.0001;
  transform[1] = ndiSignedToLong(&readPointer[6], 6) * 0.0001;
  transform[2] = ndiSignedToLong(&readPointer[12], 6) * 0.0001;
  transform[3] = ndiSignedToLong(&readPointer[18], 6) * 0.0001;
  transform[4] = ndiSignedToLong(&readPointer[24], 7) * 0.01;
  transform[5] = ndiSignedToLong(&readPointer[31], 7) * 0.01;
  transform[6] = ndiSignedToLong(&readPointer[38], 7) * 0.01;
  transform[7] = ndiSignedToLong(&readPointer[45], 6) * 0.0001;

  return NDI_OKAY;
}